

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

QByteArray *
formatConnectionSignature(QByteArray *__return_storage_ptr__,char *className,QMetaMethod *method)

{
  bool bVar1;
  uint uVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<const_char_*&,_QByteArray>,_QByteArray> local_a0;
  QByteArray local_68;
  QByteArray local_48;
  char *local_30;
  QByteArray *local_28;
  
  local_28 = *(QByteArray **)(in_FS_OFFSET + 0x28);
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = className;
  QMetaMethod::methodSignature(&local_48,method);
  qVar3 = QByteArray::indexOf(&local_48,'(',0);
  uVar2 = (uint)qVar3;
  if ((int)uVar2 < 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
    if ((long)(ulong)(uVar2 & 0x7fffffff) < (long)(local_48.d.size + -2)) {
      QByteArray::mid(&local_68,&local_48,(long)(int)(uVar2 + 1),
                      (qsizetype)(local_48.d.size + (-2 - (ulong)(uVar2 & 0x7fffffff))));
      local_a0.a.b.d.size = local_68.d.size;
      local_a0.a.b.d.ptr = local_68.d.ptr;
      local_a0.a.b.d.d = local_68.d.d;
      local_68.d.size = 0;
      local_a0.a.a = (char **)0x4d3df1;
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (char *)0x0;
      local_a0.b.d.d = (Data *)0x4d3dfc;
      QtStringBuilder::
      appendToByteArray<QStringBuilder<char_const(&)[11],QByteArray>,char_const(&)[3]>
                (__return_storage_ptr__,
                 (QStringBuilder<QStringBuilder<const_char_(&)[11],_QByteArray>,_const_char_(&)[3]>
                  *)&local_a0,'\0');
      if (&(local_a0.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a0.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a0.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if (((local_a0.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_a0.a.b.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
        }
      }
      bVar1 = true;
      goto LAB_002b849a;
    }
  }
  bVar1 = false;
LAB_002b849a:
  QByteArray::append(__return_storage_ptr__,'&');
  QMetaMethod::name(&local_68,method);
  local_a0.b.d.size = local_68.d.size;
  local_a0.b.d.ptr = local_68.d.ptr;
  local_a0.b.d.d = local_68.d.d;
  local_a0.a.a = &local_30;
  local_a0.a.b.d.d = (Data *)0x0;
  local_a0.a.b.d.ptr = "::";
  local_a0.a.b.d.size = 2;
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char *)0x0;
  local_68.d.size = 0;
  QtStringBuilder::appendToByteArray<QStringBuilder<char_const*&,QByteArray>,QByteArray>
            (__return_storage_ptr__,&local_a0,'\0');
  QStringBuilder<QStringBuilder<const_char_*&,_QByteArray>,_QByteArray>::~QStringBuilder(&local_a0);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (bVar1) {
    QByteArray::append(__return_storage_ptr__,')');
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(QByteArray **)(in_FS_OFFSET + 0x28) == local_28) {
    return *(QByteArray **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray formatConnectionSignature(const char *className, const QMetaMethod &method)
{
    const auto signature = method.methodSignature();
    Q_ASSERT(signature.endsWith(')'));
    const int openParen = signature.indexOf('(');
    const bool hasParameters = openParen >= 0 && openParen < signature.size() - 2;
    QByteArray result;
    if (hasParameters) {
        result += "qOverload<"
            + signature.mid(openParen + 1, signature.size() - openParen - 2) + ">(";
    }
    result += '&';
    result += className + QByteArrayLiteral("::") + method.name();
    if (hasParameters)
        result += ')';
    return result;
}